

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

uint cimg_library::cimg::_wait(uint milliseconds,unsigned_long *timer)

{
  unsigned_long uVar1;
  ulong uVar2;
  ulong uVar3;
  uint __seconds;
  undefined4 in_register_0000003c;
  time_t *__timer;
  
  __timer = (time_t *)CONCAT44(in_register_0000003c,milliseconds);
  if (*timer == 0) {
    uVar1 = time(__timer);
    *timer = uVar1;
  }
  uVar2 = time(__timer);
  uVar3 = (ulong)milliseconds + *timer;
  if (uVar2 < uVar3) {
    __seconds = (int)uVar3 - (int)uVar2;
    *timer = uVar3;
    sleep(__seconds);
  }
  else {
    *timer = uVar2;
    __seconds = 0;
  }
  return __seconds;
}

Assistant:

inline unsigned int _wait(const unsigned int milliseconds, unsigned long& timer) {
      if (!timer) timer = cimg::time();
      const unsigned long current_time = cimg::time();
      if (current_time>=timer+milliseconds) { timer = current_time; return 0; }
      const unsigned long time_diff = timer + milliseconds - current_time;
      timer = current_time + time_diff;
      cimg::sleep(time_diff);
      return (unsigned int)time_diff;
    }